

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O0

IVec2 __thiscall deqp::ShaderRenderCase::getViewportSize(ShaderRenderCase *this)

{
  int iVar1;
  int iVar2;
  RenderTarget *pRVar3;
  long in_RSI;
  ShaderRenderCase *this_local;
  
  pRVar3 = (RenderTarget *)(**(code **)(**(long **)(in_RSI + 0x70) + 0x20))();
  iVar1 = tcu::RenderTarget::getWidth(pRVar3);
  iVar1 = de::min<int>(iVar1,0x80);
  pRVar3 = (RenderTarget *)(**(code **)(**(long **)(in_RSI + 0x70) + 0x20))();
  iVar2 = tcu::RenderTarget::getHeight(pRVar3);
  iVar2 = de::min<int>(iVar2,0x70);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,iVar1,iVar2);
  return (IVec2)(int  [2])this;
}

Assistant:

tcu::IVec2 ShaderRenderCase::getViewportSize(void) const
{
	return tcu::IVec2(de::min(m_renderCtx.getRenderTarget().getWidth(), MAX_RENDER_WIDTH),
					  de::min(m_renderCtx.getRenderTarget().getHeight(), MAX_RENDER_HEIGHT));
}